

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void vera::refineSdfLayers
               (BVH *_acc,vector<vera::Image,_std::allocator<vera::Image>_> *_images,float _dist)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined8 *puVar5;
  pointer ptVar6;
  int iVar7;
  value_type *__val;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  thread *t;
  pointer ptVar11;
  size_t i;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  samples;
  thread thrd;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  default_random_engine generator;
  long *local_b0;
  undefined8 *local_a8;
  undefined8 *puStack_a0;
  undefined8 *local_98;
  thread local_88;
  float local_80;
  float local_7c;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  long local_58;
  BVH *local_50;
  vector<vera::Image,_std::allocator<vera::Image>_> *local_48;
  double local_40;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  pIVar1 = (_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar2 = (_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (_acc->elements).super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (_acc->super_BoundingBox).max.field_0.x - (_acc->super_BoundingBox).min.field_0.x;
  fVar17 = (_acc->super_BoundingBox).max.field_1.y - (_acc->super_BoundingBox).min.field_1.y;
  fVar15 = (_acc->super_BoundingBox).max.field_2.z - (_acc->super_BoundingBox).min.field_2.z;
  fVar15 = fVar15 * fVar15 + fVar17 * fVar17 + fVar16 * fVar16;
  pTVar4 = (_acc->elements).super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_80 = _dist;
  local_50 = _acc;
  local_48 = _images;
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  local_38._M_x = 1;
  local_98 = (undefined8 *)0x0;
  local_a8 = (undefined8 *)0x0;
  puStack_a0 = (undefined8 *)0x0;
  local_a8 = (undefined8 *)operator_new(0x300);
  puStack_a0 = local_a8 + 0x60;
  *local_a8 = 0;
  *(undefined4 *)(local_a8 + 1) = 0;
  lVar9 = 0xc;
  do {
    *(undefined4 *)((long)local_a8 + lVar9 + 8) = *(undefined4 *)(local_a8 + 1);
    *(undefined8 *)((long)local_a8 + lVar9) = *local_a8;
    lVar9 = lVar9 + 0xc;
  } while (lVar9 != 0x300);
  local_58 = ((long)pIVar1 - (long)pIVar2 >> 4) * 0x6db6db6db6db6db7;
  uVar14 = ((long)pTVar3 - (long)pTVar4 >> 4) * 0x2e8ba2e8ba2e8ba3;
  lVar9 = 0;
  lVar12 = 0;
  local_98 = puStack_a0;
  do {
    fVar16 = std::
             generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (&local_38);
    local_40 = (double)(fVar16 + 0.0) + (double)(fVar16 + 0.0) + -1.0;
    local_7c = std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&local_38);
    fVar16 = std::
             generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (&local_38);
    puVar5 = local_a8;
    *(float *)((long)local_a8 + lVar9) = (float)local_40;
    *(float *)((long)local_a8 + lVar9 + 4) = local_7c + 0.0 + local_7c + 0.0 + -1.0;
    *(float *)((long)local_a8 + lVar9 + 8) = fVar16 + 0.0 + fVar16 + 0.0 + -1.0;
    fVar16 = *(float *)((long)local_a8 + lVar9 + 4);
    fVar17 = *(float *)((long)local_a8 + lVar9 + 8);
    fVar16 = fVar17 * fVar17 +
             fVar16 * fVar16 +
             *(float *)((long)local_a8 + lVar9) * *(float *)((long)local_a8 + lVar9);
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    fVar16 = 1.0 / fVar16;
    fVar17 = *(float *)((long)puVar5 + lVar9 + 8);
    *(ulong *)((long)local_a8 + lVar9) =
         CONCAT44(*(float *)((long)puVar5 + lVar9 + 4) * fVar16,
                  *(float *)((long)puVar5 + lVar9) * fVar16);
    *(float *)((long)local_a8 + lVar9 + 8) = fVar16 * fVar17;
    fVar16 = (float)((double)lVar12 * 0.015625) * (float)((double)lVar12 * 0.015625) * 0.9 + 0.1;
    *(float *)((long)local_a8 + lVar9) = *(float *)((long)local_a8 + lVar9) * fVar16;
    *(float *)((long)local_a8 + lVar9 + 4) = *(float *)((long)local_a8 + lVar9 + 4) * fVar16;
    *(float *)((long)local_a8 + lVar9 + 8) = fVar16 * *(float *)((long)local_a8 + lVar9 + 8);
    lVar12 = lVar12 + 1;
    lVar9 = lVar9 + 0xc;
  } while (lVar12 != 0x40);
  iVar7 = std::thread::hardware_concurrency();
  uVar13 = (ulong)iVar7;
  uVar8 = uVar14 / uVar13;
  lVar9 = 0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    local_88._M_id._M_thread = (id)0;
    local_b0 = (long *)operator_new(0x40);
    lVar12 = lVar9 * uVar8;
    uVar10 = 0;
    if (iVar7 + -1 == lVar9) {
      uVar10 = uVar14 % uVar13;
    }
    *local_b0 = (long)&PTR___State_003ec4a0;
    local_b0[1] = (long)local_50;
    local_b0[2] = (long)local_48;
    local_b0[3] = (long)&local_a8;
    local_b0[4] = lVar12;
    local_b0[5] = uVar10 + lVar12 + uVar8;
    local_b0[6] = local_58;
    *(float *)(local_b0 + 7) = fVar15 * 0.5;
    *(float *)((long)local_b0 + 0x3c) = local_80;
    std::thread::_M_start_thread(&local_88,&local_b0,0);
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_78,&local_88);
    ptVar6 = local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_88._M_id._M_thread != 0) break;
    lVar9 = lVar9 + 1;
    ptVar11 = local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (uVar13 + (uVar13 == 0) == lVar9) {
      for (; ptVar11 != ptVar6; ptVar11 = ptVar11 + 1) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
      if (local_a8 != (undefined8 *)0x0) {
        operator_delete(local_a8);
      }
      return;
    }
  }
  std::terminate();
}

Assistant:

void refineSdfLayers(const BVH* _acc, std::vector<Image>& _images, float _dist) {

    size_t voxel_resolution = _images.size();
    float voxel_size        = 1.0/float(voxel_resolution);

    size_t triangles_total  = _acc->elements.size(); 
    glm::vec3 bdiagonal     = _acc->getDiagonal();
    float max_dist          = glm::length(bdiagonal) * 0.5f;

    std::uniform_real_distribution<float> randomFloats(0.0, 1.0); // random floats between [0.0, 1.0]
    std::default_random_engine generator;

    // Random vectors
    std::vector<glm::vec3> samples(64);
    for (size_t i = 0; i < 64; ++i) {
        samples[i] = glm::vec3( randomFloats(generator) * 2.0 - 1.0, 
                                randomFloats(generator) * 2.0 - 1.0, 
                                randomFloats(generator) * 2.0 - 1.0);
        samples[i] = glm::normalize(samples[i]);
        float scale = (float)i / 64.0;
        scale   = vera::lerp(0.1f, 1.0f, scale * scale);
        samples[i] *= scale;
    }

    const int nThreads      = std::thread::hardware_concurrency();
    size_t trisPerThread    = triangles_total / nThreads;
    size_t trisLeftOver     = triangles_total % nThreads;

    std::vector<std::thread> threads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start = i * trisPerThread;
        size_t end = start + trisPerThread;
        if (i == nThreads - 1)
            end = start + trisPerThread + trisLeftOver;

        std::thread thrd(
            [_acc, &_images, &samples, start, end, voxel_resolution, max_dist, _dist]() {
                for (size_t t = start; t < end; t++) {
                    // glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                    // p = _acc->min + p * bdiagonal;

                    glm::vec3 p = _acc->elements[t].getCentroid();
                    p = p + (_acc->elements[t].getNormal() * max_dist * _dist) + samples[t%64] * max_dist * _dist * 0.5f;

                    if (_acc->contains(p)) {
                        glm::vec4 c = _acc->getClosestRGBSignedDistance(p);
                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                        glm::ivec3 v = remap(p, _acc->min, _acc->max, glm::vec3(0.0f), glm::vec3(voxel_resolution), true);
                        size_t z = v.z % voxel_resolution;
                        size_t index = _images[z].getIndex(v.x % voxel_resolution, v.y % voxel_resolution);
                        _images[z].setColor(index, c);
                    }
                }
            }
        );
        threads.push_back(std::move(thrd));
    }

    for (std::thread& t : threads)
        t.join();
}